

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
          (LoopUnrollerUtilsImpl *this,Loop *loop)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  LoopUnrollerUtilsImpl *pLVar1;
  pointer ppBVar2;
  pointer puVar3;
  IRContext *this_01;
  Loop *this_02;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *this_03;
  uint32_t uVar4;
  uint32_t before;
  Instruction *this_04;
  mapped_type *pmVar5;
  uint32_t operand_label;
  uint32_t label;
  uint32_t label_00;
  size_t index;
  pointer ppIVar6;
  ulong uVar7;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *block_itr;
  pointer ppBVar8;
  pointer puVar9;
  pointer ppIVar10;
  long lVar11;
  initializer_list<unsigned_int> init_list;
  uint32_t local_7c;
  Loop *local_78;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_70;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  Instruction *merge_inst;
  
  Unroll(this,loop,this->number_of_loop_iterations_);
  FoldConditionBlock(this,this->loop_condition_block_,operand_label);
  merge_inst = BasicBlock::GetLoopMergeInst(loop->loop_header_);
  local_70 = &this->invalidated_instructions_;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  push_back(local_70,&merge_inst);
  this_04 = BasicBlock::terminator((this->state_).previous_latch_block_);
  local_7c = BasicBlock::id(loop->loop_merge_);
  init_list._M_len = 1;
  init_list._M_array = &local_7c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&inductions,init_list);
  Instruction::SetInOperand(this_04,0,(SmallVector<unsigned_int,_2UL> *)&inductions);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&inductions)
  ;
  IRContext::UpdateDefUse(this->context_,this_04);
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = loop;
  Loop::GetInductionVariables(loop,&inductions);
  this_00 = &(this->state_).new_inst;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  ppIVar10 = inductions.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar6 = inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 = local_70, ppIVar6 != ppIVar10;
      ppIVar6 = ppIVar6 + 1) {
    pLVar1 = (LoopUnrollerUtilsImpl *)*ppIVar6;
    uVar4 = BasicBlock::id(local_78->loop_preheader_);
    uVar4 = GetPhiDefID(pLVar1,(Instruction *)(ulong)uVar4,label);
    local_7c = Instruction::result_id((Instruction *)pLVar1);
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_7c);
    *pmVar5 = uVar4;
  }
  ppBVar2 = (this->loop_blocks_inorder_).
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar8 = (this->loop_blocks_inorder_).
                 super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar2;
      ppBVar8 = ppBVar8 + 1) {
    RemapOperands(this,*ppBVar8);
  }
  puVar3 = (this->blocks_to_add_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->blocks_to_add_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1) {
    RemapOperands(this,(puVar9->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  }
  ppIVar6 = (this->state_).previous_phis_.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar10 = (this->state_).previous_phis_.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar10 != ppIVar6;
      ppIVar10 = ppIVar10 + 1) {
    RemapOperands(this,*ppIVar10);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  local_78->loop_is_marked_for_removal_ = true;
  if (local_78->parent_ != (Loop *)0x0) {
    AddBlocksToLoop(this,local_78->parent_);
  }
  this_02 = local_78;
  AddBlocksToFunction(this,local_78->loop_merge_);
  IRContext::InvalidateAnalysesExceptFor
            (this->context_,kAnalysisLoopAnalysis|kAnalysisInstrToBlockMapping|kAnalysisBegin);
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Loop::GetInductionVariables(this_02,&inductions);
  lVar11 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)inductions.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inductions.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    pLVar1 = *(LoopUnrollerUtilsImpl **)
              ((long)(this->state_).previous_phis_.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar11);
    uVar4 = BasicBlock::id((this->state_).previous_latch_block_);
    uVar4 = GetPhiDefID(pLVar1,(Instruction *)(ulong)uVar4,label_00);
    this_01 = this->context_;
    before = Instruction::result_id
                       (*(Instruction **)
                         ((long)inductions.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar11));
    IRContext::ReplaceAllUsesWith(this_01,before,uVar4);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back(this_03,(value_type *)
                      ((long)inductions.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar11));
    lVar11 = lVar11 + 8;
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&inductions.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  RemoveDeadInstructions(this);
  IRContext::InvalidateAnalysesExceptFor(this->context_,kAnalysisLoopAnalysis|kAnalysisBegin);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::FullyUnroll(Loop* loop) {
  // We unroll the loop by number of iterations in the loop.
  Unroll(loop, number_of_loop_iterations_);

  // The first condition block is preserved until now so it can be copied.
  FoldConditionBlock(loop_condition_block_, 1);

  // Delete the OpLoopMerge and remove the backedge to the header.
  CloseUnrolledLoop(loop);

  // Mark the loop for later deletion. This allows us to preserve the loop
  // iterators but still disregard dead loops.
  loop->MarkLoopForRemoval();

  // If the loop has a parent add the new blocks to the parent.
  if (loop->GetParent()) {
    AddBlocksToLoop(loop->GetParent());
  }

  // Add the blocks to the function.
  AddBlocksToFunction(loop->GetMergeBlock());

  ReplaceInductionUseWithFinalValue(loop);

  RemoveDeadInstructions();
  // Invalidate all analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse);
}